

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX
          (RayTracingPipelineStateCreateInfoX *this,RayTracingPipelineStateCreateInfo *_Desc)

{
  RayTracingGeneralShaderGroup *__first;
  RayTracingTriangleHitShaderGroup *__first_00;
  RayTracingProceduralHitShaderGroup *__first_01;
  RayTracingPipelineStateCreateInfo *_Desc_local;
  RayTracingPipelineStateCreateInfoX *this_local;
  
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ::PipelineStateCreateInfoX
            (&this->
              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ,_Desc);
  std::
  vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ::vector(&this->GeneralShaders);
  std::
  vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ::vector(&this->TriangleHitShaders);
  std::
  vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ::vector(&this->ProceduralHitShaders);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ::vector(&this->ShaderObjects);
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount != 0) {
    __first = (this->
              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
              ).super_RayTracingPipelineStateCreateInfo.pGeneralShaders;
    std::
    vector<Diligent::RayTracingGeneralShaderGroup,std::allocator<Diligent::RayTracingGeneralShaderGroup>>
    ::assign<Diligent::RayTracingGeneralShaderGroup_const*,void>
              ((vector<Diligent::RayTracingGeneralShaderGroup,std::allocator<Diligent::RayTracingGeneralShaderGroup>>
                *)&this->GeneralShaders,__first,
               __first + (this->
                         super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                         ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount != 0) {
    __first_00 = (this->
                 super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 ).super_RayTracingPipelineStateCreateInfo.pTriangleHitShaders;
    std::
    vector<Diligent::RayTracingTriangleHitShaderGroup,std::allocator<Diligent::RayTracingTriangleHitShaderGroup>>
    ::assign<Diligent::RayTracingTriangleHitShaderGroup_const*,void>
              ((vector<Diligent::RayTracingTriangleHitShaderGroup,std::allocator<Diligent::RayTracingTriangleHitShaderGroup>>
                *)&this->TriangleHitShaders,__first_00,
               __first_00 +
               (this->
               super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
               ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount);
  }
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount != 0) {
    __first_01 = (this->
                 super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 ).super_RayTracingPipelineStateCreateInfo.pProceduralHitShaders;
    std::
    vector<Diligent::RayTracingProceduralHitShaderGroup,std::allocator<Diligent::RayTracingProceduralHitShaderGroup>>
    ::assign<Diligent::RayTracingProceduralHitShaderGroup_const*,void>
              ((vector<Diligent::RayTracingProceduralHitShaderGroup,std::allocator<Diligent::RayTracingProceduralHitShaderGroup>>
                *)&this->ProceduralHitShaders,__first_01,
               __first_01 +
               (this->
               super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
               ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount);
  }
  SyncDesc(this,SYNC_FLAG_ALL);
  return;
}

Assistant:

RayTracingPipelineStateCreateInfoX(const RayTracingPipelineStateCreateInfo& _Desc) :
        PipelineStateCreateInfoX{_Desc}
    {
        if (GeneralShaderCount != 0)
            GeneralShaders.assign(pGeneralShaders, pGeneralShaders + GeneralShaderCount);

        if (TriangleHitShaderCount != 0)
            TriangleHitShaders.assign(pTriangleHitShaders, pTriangleHitShaders + TriangleHitShaderCount);

        if (ProceduralHitShaderCount != 0)
            ProceduralHitShaders.assign(pProceduralHitShaders, pProceduralHitShaders + ProceduralHitShaderCount);

        SyncDesc(SYNC_FLAG_ALL);
    }